

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

int Dau_ParseFormulaAig_rec(Gia_Man_t *p,char *pBeg,char *pEnd)

{
  char cVar1;
  int iVar2;
  int iLit1;
  char *pcVar3;
  uint c;
  char *pcVar4;
  
  pcVar4 = pEnd + ~(ulong)pBeg;
  c = 0;
  for (; cVar1 = *pBeg, cVar1 == '~'; pBeg = pBeg + 1) {
    c = c ^ 1;
    pcVar4 = pcVar4 + -1;
  }
  if (pBeg + 1 == pEnd) {
    if ((byte)(cVar1 + 0x9fU) < 6) {
      return c + (byte)(cVar1 * '\x02' + 0x40);
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                  ,0xb3,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
  }
  if (cVar1 == '(') {
    pcVar3 = Dau_ParseFormulaEndToken(pBeg);
    if (pcVar3 == pEnd) {
      if (*pBeg != '(') {
        __assert_fail("pBeg[0] == \'(\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                      ,0xbb,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
      }
      if (pBeg[(long)pcVar4] == ')') {
        iVar2 = Dau_ParseFormulaAig_rec(p,pBeg + 1,pEnd + -1);
        iVar2 = Abc_LitNotCond(iVar2,c);
        return iVar2;
      }
      __assert_fail("pBeg[pEnd-pBeg-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xbc,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
  }
  pcVar4 = Dau_ParseFormulaEndToken(pBeg);
  iVar2 = Dau_ParseFormulaAig_rec(p,pBeg,pcVar4);
  iVar2 = Abc_LitNotCond(iVar2,c);
  cVar1 = *pcVar4;
  pcVar3 = Dau_ParseFormulaEndToken(pcVar4 + 1);
  iLit1 = Dau_ParseFormulaAig_rec(p,pcVar4 + 1,pcVar3);
  if (cVar1 == '^') {
    iVar2 = Gia_ManHashXor(p,iVar2,iLit1);
    return iVar2;
  }
  if (cVar1 == '&') {
    iVar2 = Gia_ManHashAnd(p,iVar2,iLit1);
    return iVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                ,0xcf,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
}

Assistant:

int Dau_ParseFormulaAig_rec( Gia_Man_t * p, char * pBeg, char * pEnd )
{
    int iFans[2], Res, Oper = -1;
    char * pEndNew;
    int fCompl = 0;
    while ( pBeg[0] == '~' )
    {
        pBeg++;
        fCompl ^= 1;
    }
    if ( pBeg + 1 == pEnd )
    {
        if ( pBeg[0] >= 'a' && pBeg[0] <= 'f' )
            return Abc_Var2Lit( 1 + pBeg[0] - 'a', fCompl );
        assert( 0 );
        return -1;
    }
    if ( pBeg[0] == '(' )
    {
        pEndNew = Dau_ParseFormulaEndToken( pBeg );
        if ( pEndNew == pEnd )
        {
            assert( pBeg[0] == '(' );
            assert( pBeg[pEnd-pBeg-1] == ')' );
            Res = Dau_ParseFormulaAig_rec( p, pBeg + 1, pEnd - 1 );
            return Abc_LitNotCond( Res, fCompl );
        }
    }
    // get first part
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[0] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    iFans[0] = Abc_LitNotCond( iFans[0], fCompl );
    Oper     = pEndNew[0];
    // get second part
    pBeg     = pEndNew + 1;
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[1] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    // derive the formula
    if ( Oper == '&' )
        return Gia_ManHashAnd( p, iFans[0], iFans[1] );
    if ( Oper == '^' )
        return Gia_ManHashXor( p, iFans[0], iFans[1] );
    assert( 0 );
    return -1;
}